

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_signature_serialize_der
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,secp256k1_ecdsa_signature *sig
              )

{
  undefined1 local_70 [8];
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ecdsa_signature *sig_local;
  size_t *outputlen_local;
  uchar *output_local;
  secp256k1_context *ctx_local;
  
  if (output == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"output != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (outputlen == (size_t *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"outputlen != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_ecdsa_signature_load
              (ctx,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)local_70,sig);
    ctx_local._4_4_ =
         secp256k1_ecdsa_sig_serialize
                   (output,outputlen,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)local_70);
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_signature_serialize_der(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_ecdsa_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(sig != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return secp256k1_ecdsa_sig_serialize(output, outputlen, &r, &s);
}